

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locbased.cpp
# Opt level: O0

char * __thiscall
icu_63::LocaleBased::getLocaleID(LocaleBased *this,ULocDataLocaleType type,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  ULocDataLocaleType type_local;
  LocaleBased *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (type == ULOC_ACTUAL_LOCALE) {
      this_local = (LocaleBased *)this->actual;
    }
    else if (type == ULOC_VALID_LOCALE) {
      this_local = (LocaleBased *)this->valid;
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      this_local = (LocaleBased *)0x0;
    }
  }
  else {
    this_local = (LocaleBased *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* LocaleBased::getLocaleID(ULocDataLocaleType type, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return NULL;
    }

    switch(type) {
    case ULOC_VALID_LOCALE:
        return valid;
    case ULOC_ACTUAL_LOCALE:
        return actual;
    default:
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
}